

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O2

bool s2shapeutil::VisitCrossings
               (S2ShapeIndex *index,CrossingType type,bool need_adjacent,EdgePairVisitor *visitor)

{
  S2ShapeIndex *index_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  S2ShapeIndexCell *cell;
  const_reference __args;
  const_reference pSVar4;
  undefined7 in_register_00000011;
  int min_crossing_sign;
  size_type i;
  size_type sVar5;
  uint64 uVar6;
  ShapeEdgeVector shape_edges;
  IteratorBase *local_460;
  size_type local_458;
  undefined4 local_44c;
  S2ShapeIndex *local_448;
  ulong local_440;
  uint64 local_438;
  EdgePairVisitor *local_430;
  S2EdgeCrosser local_428;
  ShapeEdgeVector local_3b8;
  
  local_44c = (undefined4)CONCAT71(in_register_00000011,need_adjacent);
  local_3b8.allocator_and_tag_.tag_.size_ = (Tag)0;
  local_430 = visitor;
  (*index->_vptr_S2ShapeIndex[6])(&local_460,index,0);
  local_448 = index;
  do {
    index_00 = local_448;
    uVar6 = (local_460->id_).id_;
    if (uVar6 == 0xffffffffffffffff) {
      (*local_460->_vptr_IteratorBase[1])();
LAB_00260bea:
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_3b8);
      return uVar6 == 0xffffffffffffffff;
    }
    cell = S2ShapeIndex::IteratorBase::cell(local_460);
    GetShapeEdges(index_00,cell,&local_3b8);
    local_440 = (ulong)local_3b8.allocator_and_tag_.tag_.size_ >> 1;
    iVar2 = (int)local_440;
    i = 0;
    local_438 = uVar6;
    while (sVar5 = i + 1, (long)sVar5 < (long)iVar2) {
      __args = absl::
               InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
               ::operator[](&local_3b8,i);
      local_458 = sVar5;
      if ((char)local_44c == '\0') {
        pSVar4 = absl::
                 InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                 ::operator[](&local_3b8,sVar5);
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)&(__args->edge_).v1,
                           &(pSVar4->edge_).v0);
        sVar5 = local_458;
        if (bVar1) {
          if ((int)local_440 <= (int)i + 2) break;
          sVar5 = i + 2;
        }
      }
      S2EdgeCrosser::S2EdgeCrosser(&local_428,&(__args->edge_).v0,&(__args->edge_).v1);
      for (sVar5 = (size_type)(int)sVar5; i = local_458, (long)sVar5 < (long)iVar2;
          sVar5 = sVar5 + 1) {
        pSVar4 = absl::
                 InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                 ::operator[](&local_3b8,sVar5);
        if (((BasicVector<Vector3,_double,_3UL> *)local_428.c_ ==
             (BasicVector<Vector3,_double,_3UL> *)0x0) ||
           (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                              ((BasicVector<Vector3,_double,_3UL> *)local_428.c_,&(pSVar4->edge_).v0
                              ), bVar1)) {
          S2EdgeCrosser::RestartAt(&local_428,&(pSVar4->edge_).v0);
        }
        iVar3 = S2EdgeCrosser::CrossingSign(&local_428,&(pSVar4->edge_).v1);
        if (((int)(uint)(type == INTERIOR) <= iVar3) &&
           (bVar1 = std::
                    function<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool)>
                    ::operator()(local_430,__args,pSVar4,iVar3 == 1), !bVar1)) {
          uVar6 = local_438;
          if (local_460 != (IteratorBase *)0x0) {
            (*local_460->_vptr_IteratorBase[1])();
            uVar6 = local_438;
          }
          goto LAB_00260bea;
        }
      }
    }
    (*local_460->_vptr_IteratorBase[4])();
  } while( true );
}

Assistant:

static bool VisitCrossings(
    const S2ShapeIndex& index, CrossingType type, bool need_adjacent,
    const EdgePairVisitor& visitor) {
  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  ShapeEdgeVector shape_edges;
  for (S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
       !it.done(); it.Next()) {
    GetShapeEdges(index, it.cell(), &shape_edges);
    if (!VisitCrossings(shape_edges, type, need_adjacent, visitor)) {
      return false;
    }
  }
  return true;
}